

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O0

int inflateBackEnd(z_streamp strm)

{
  z_streamp strm_local;
  
  if (((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) ||
     (strm->zfree == (free_func)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateBackEnd(strm)
z_streamp strm;
{
    if (strm == Z_NULL || strm->state == Z_NULL || strm->zfree == (free_func)0)
        return Z_STREAM_ERROR;
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}